

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall
Imf_3_4::CompositeDeepScanLine::addSource(CompositeDeepScanLine *this,DeepScanLineInputFile *file)

{
  pointer *pppDVar1;
  Data *pDVar2;
  iterator __position;
  Header *header;
  DeepScanLineInputFile *local_20;
  
  pDVar2 = this->_Data;
  local_20 = file;
  header = DeepScanLineInputFile::header(file);
  Data::check_valid(pDVar2,header);
  pDVar2 = this->_Data;
  __position._M_current =
       (pDVar2->_file).
       super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pDVar2->_file).
      super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Imf_3_4::DeepScanLineInputFile*,std::allocator<Imf_3_4::DeepScanLineInputFile*>>::
    _M_realloc_insert<Imf_3_4::DeepScanLineInputFile*const&>
              ((vector<Imf_3_4::DeepScanLineInputFile*,std::allocator<Imf_3_4::DeepScanLineInputFile*>>
                *)pDVar2,__position,&local_20);
  }
  else {
    *__position._M_current = file;
    pppDVar1 = &(pDVar2->_file).
                super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar1 = *pppDVar1 + 1;
  }
  return;
}

Assistant:

void
CompositeDeepScanLine::addSource (DeepScanLineInputFile* file)
{
    _Data->check_valid (file->header ());
    _Data->_file.push_back (file);
}